

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_norm_tec_zone(REF_GRID ref_grid,REF_INT id,FILE *file)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  REF_STATUS RVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  int iVar11;
  long lVar12;
  REF_INT node;
  double dVar13;
  REF_DICT ref_dict;
  REF_INT local;
  REF_DBL area_sign;
  REF_DBL uv [2];
  REF_DBL n [3];
  REF_INT nodes [27];
  REF_DBL s [3];
  REF_DBL r [3];
  int local_144;
  REF_DICT local_140;
  undefined4 local_134;
  FILE *local_130;
  uint local_128;
  int local_124;
  REF_NODE local_120;
  REF_GRID local_118;
  double local_110;
  REF_DBL local_108;
  REF_DBL local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  REF_INT local_d8 [3];
  int local_cc;
  REF_DBL local_68 [4];
  REF_DBL local_48 [3];
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  local_130 = (FILE *)file;
  uVar5 = ref_dict_create(&local_140);
  if (uVar5 == 0) {
    uVar5 = 0;
    local_134 = 0;
    local_120 = pRVar1;
    local_118 = ref_grid;
    if (ref_geom->max < 1) {
      lVar12 = 0;
    }
    else {
      lVar9 = 0;
      lVar12 = 0;
      do {
        pRVar2 = ref_geom->descr;
        if (((*(int *)((long)pRVar2 + lVar9) == 2) && (*(int *)((long)pRVar2 + lVar9 + 4) == id)) &&
           (uVar6 = ref_dict_store(local_140,*(REF_INT *)((long)pRVar2 + lVar9 + 0x14),
                                   (REF_INT)lVar12), uVar6 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0xd6f,"ref_geom_norm_tec_zone",(ulong)uVar6,"mark nodes");
          return uVar6;
        }
        lVar12 = lVar12 + 1;
        lVar9 = lVar9 + 0x18;
      } while (lVar12 < ref_geom->max);
    }
    local_144 = (int)lVar12;
    local_128 = local_140->n;
    if (0 < ref_cell->max) {
      iVar11 = 0;
      uVar5 = 0;
      do {
        RVar7 = ref_cell_nodes(ref_cell,iVar11,local_d8);
        uVar5 = uVar5 + (local_cc == id && RVar7 == 0);
        iVar11 = iVar11 + 1;
      } while (iVar11 < ref_cell->max);
    }
    if ((local_128 == 0) || (uVar5 == 0)) {
      uVar5 = ref_dict_free(local_140);
      if (uVar5 == 0) {
        return 0;
      }
      pcVar10 = "free dict";
      uVar8 = 0xd7d;
    }
    else {
      fprintf(local_130,"zone t=\"norm%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              (ulong)(uint)id,(ulong)local_128,(ulong)uVar5,"point","fetriangle");
      local_144 = -1;
      node = -1;
      if (0 < local_140->n) {
        node = *local_140->key;
        local_144 = *local_140->value;
      }
      if (0 < local_140->n) {
        lVar12 = 1;
        do {
          uVar5 = ref_geom_find(ref_geom,node,2,id,&local_144);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xd87,"ref_geom_norm_tec_zone",(ulong)uVar5,"not found");
            return uVar5;
          }
          local_108 = ref_geom->param[(long)local_144 * 2];
          local_100 = ref_geom->param[local_144 * 2 + 1];
          uVar5 = ref_geom_face_rsn(ref_geom,id,&local_108,local_48,local_68,&local_f8);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xd8a,"ref_geom_norm_tec_zone",(ulong)uVar5,"rsn");
            return uVar5;
          }
          uVar5 = ref_geom_uv_area_sign(local_118,id,&local_110);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xd8b,"ref_geom_norm_tec_zone",(ulong)uVar5,"a sign");
            return uVar5;
          }
          pRVar3 = local_120->real;
          lVar9 = (long)(node * 0xf);
          dVar13 = -local_110;
          fprintf(local_130," %.16e %.16e %.16e %.16e %.16e %.16e\n",pRVar3[lVar9],pRVar3[lVar9 + 1]
                  ,pRVar3[lVar9 + 2],local_f8 * dVar13,local_f0 * dVar13,dVar13 * local_e8);
          local_144 = -1;
          node = -1;
          if (lVar12 < local_140->n) {
            node = local_140->key[lVar12];
            local_144 = local_140->value[lVar12];
          }
          bVar4 = lVar12 < local_140->n;
          lVar12 = lVar12 + 1;
        } while (bVar4);
      }
      if (0 < ref_cell->max) {
        iVar11 = 0;
        do {
          RVar7 = ref_cell_nodes(ref_cell,iVar11,local_d8);
          if ((RVar7 == 0) && (local_cc == id)) {
            lVar12 = 0;
            do {
              uVar5 = ref_dict_location(local_140,local_d8[lVar12],&local_124);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                       ,0xd95,"ref_geom_norm_tec_zone",(ulong)uVar5,"localize");
                return uVar5;
              }
              fprintf(local_130," %d",(ulong)(local_124 + 1));
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            fputc(10,local_130);
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 < ref_cell->max);
      }
      uVar5 = ref_dict_free(local_140);
      if (uVar5 == 0) {
        return 0;
      }
      pcVar10 = "free dict";
      uVar8 = 0xd9c;
    }
  }
  else {
    pcVar10 = "create dict";
    uVar8 = 0xd6a;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar8,
         "ref_geom_norm_tec_zone",(ulong)uVar5,pcVar10);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_geom_norm_tec_zone(REF_GRID ref_grid, REF_INT id,
                                          FILE *file) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_DICT ref_dict;
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local, node;
  REF_INT nnode, ntri;
  REF_DBL r[3], s[3], n[3], uv[2];
  REF_DBL area_sign;

  RSS(ref_dict_create(&ref_dict), "create dict");

  each_ref_geom_face(ref_geom, geom) {
    if (id == ref_geom_id(ref_geom, geom)) {
      RSS(ref_dict_store(ref_dict, ref_geom_node(ref_geom, geom), geom),
          "mark nodes");
    }
  }
  nnode = ref_dict_n(ref_dict);

  ntri = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      ntri++;
    }
  }

  /* skip degenerate */
  if (0 == nnode || 0 == ntri) {
    RSS(ref_dict_free(ref_dict), "free dict");
    return REF_SUCCESS;
  }

  fprintf(
      file,
      "zone t=\"norm%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      id, nnode, ntri, "point", "fetriangle");

  each_ref_dict_key_value(ref_dict, item, node, geom) {
    RSS(ref_geom_find(ref_geom, node, REF_GEOM_FACE, id, &geom), "not found");
    uv[0] = ref_geom_param(ref_geom, 0, geom);
    uv[1] = ref_geom_param(ref_geom, 1, geom);
    RSS(ref_geom_face_rsn(ref_geom, id, uv, r, s, n), "rsn");
    RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign), "a sign");
    fprintf(file, " %.16e %.16e %.16e %.16e %.16e %.16e\n",
            ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
            ref_node_xyz(ref_node, 2, node), -area_sign * n[0],
            -area_sign * n[1], -area_sign * n[2]);
  }

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (id == nodes[3]) {
      for (node = 0; node < 3; node++) {
        RSS(ref_dict_location(ref_dict, nodes[node], &local), "localize");
        fprintf(file, " %d", local + 1);
      }
      fprintf(file, "\n");
    }
  }

  RSS(ref_dict_free(ref_dict), "free dict");

  return REF_SUCCESS;
}